

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAnalytic_mels.c
# Opt level: O3

int MatrixEmbeddedLSSolve(SUNLinearSolver LS,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  uint uVar1;
  int iVar2;
  void *user_data;
  sunrealtype gamma;
  sunrealtype rl1;
  sunrealtype tcur;
  N_Vector zn1;
  N_Vector fn;
  N_Vector ypred;
  N_Vector y;
  
  uVar1 = CVodeGetNonlinearSystemData(LS->content,&tcur,&ypred,&y,&fn,&gamma,&rl1,&zn1,&user_data);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","CVodeGetNonlinearSystemData"
            ,(ulong)uVar1);
    iVar2 = -1;
  }
  else {
    **(double **)((long)x->content + 0x10) =
         **(double **)((long)b->content + 0x10) / (1.0 - gamma * *user_data);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int MatrixEmbeddedLSSolve(SUNLinearSolver LS, SUNMatrix A, N_Vector x,
                                 N_Vector b, sunrealtype tol)
{
  /* temporary variables */
  int retval;
  N_Vector y, ypred, fn, zn1;
  sunrealtype tcur, gamma, rl1;
  void* user_data;
  sunrealtype* rdata;
  sunrealtype lamda;

  /* retrieve implicit system data from CVode */
  retval = CVodeGetNonlinearSystemData(LS->content, &tcur, &ypred, &y, &fn,
                                       &gamma, &rl1, &zn1, &user_data);
  if (check_retval((void*)&retval, "CVodeGetNonlinearSystemData", 1))
  {
    return (-1);
  }

  /* extract stiffness parameter from user_data */
  rdata = (sunrealtype*)user_data;
  lamda = rdata[0];

  /* perform linear solve: (1-gamma*lamda)*x = b */
  NV_Ith_S(x, 0) = NV_Ith_S(b, 0) / (1 - gamma * lamda);

  /* return with success */
  return (SUN_SUCCESS);
}